

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int status_value;
  int local_13c;
  string local_138;
  int local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = 0;
  if ((this->super_DeathTestImpl).spawned_ == true) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    while( true ) {
      _Var1 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x3c,&local_13c,0);
      if (_Var1 != -1) break;
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"CHECK failed: File ","");
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_70,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
        local_f0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == paVar5) {
          local_f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_f0._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_f0,", line ");
        local_110._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p == paVar5) {
          local_110.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_110._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        local_114 = 0x43b;
        StreamableToString<int>(&local_90,&local_114);
        std::operator+(&local_50,&local_110,&local_90);
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_50,": ");
        local_d0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == paVar5) {
          local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_d0._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_d0,"waitpid(child_pid_, &status_value, 0)");
        local_b0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == paVar5) {
          local_b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_b0._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_b0," != -1");
        local_138._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p == paVar5) {
          local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_138._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        DeathTestAbort(&local_138);
      }
    }
    (this->super_DeathTestImpl).status_ = local_13c;
    iVar2 = local_13c;
  }
  return iVar2;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned()) return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}